

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

void secp256k1_musig_ge_serialize_ext(uchar *out33,secp256k1_ge *ge)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long extraout_RDX;
  uint uVar4;
  size_t size;
  size_t local_18;
  
  secp256k1_ge_verify(ge);
  if (ge->infinity != 0) {
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    out33[0x14] = '\0';
    out33[0x15] = '\0';
    out33[0x16] = '\0';
    out33[0x17] = '\0';
    out33[0x18] = '\0';
    out33[0x19] = '\0';
    out33[0x1a] = '\0';
    out33[0x1b] = '\0';
    out33[0x1c] = '\0';
    out33[0x1d] = '\0';
    out33[0x1e] = '\0';
    out33[0x1f] = '\0';
    out33[0] = '\0';
    out33[1] = '\0';
    out33[2] = '\0';
    out33[3] = '\0';
    out33[4] = '\0';
    out33[5] = '\0';
    out33[6] = '\0';
    out33[7] = '\0';
    out33[8] = '\0';
    out33[9] = '\0';
    out33[10] = '\0';
    out33[0xb] = '\0';
    out33[0xc] = '\0';
    out33[0xd] = '\0';
    out33[0xe] = '\0';
    out33[0xf] = '\0';
    out33[0x20] = '\0';
    return;
  }
  local_18 = 0x21;
  iVar2 = secp256k1_eckey_pubkey_serialize(ge,out33,&local_18,1);
  if ((iVar2 != 0) && (local_18 == 0x21)) {
    return;
  }
  secp256k1_musig_ge_serialize_ext_cold_1();
  if (ge == (secp256k1_ge *)0x0) {
    secp256k1_musig_partial_sig_parse_cold_3();
  }
  else if (out33 != (uchar *)0x0) {
    if (extraout_RDX == 0) {
      secp256k1_musig_partial_sig_parse_cold_1();
      return;
    }
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    out33[0x14] = '\0';
    out33[0x15] = '\0';
    out33[0x16] = '\0';
    out33[0x17] = '\0';
    out33[0x18] = '\0';
    out33[0x19] = '\0';
    out33[0x1a] = '\0';
    out33[0x1b] = '\0';
    out33[0x1c] = '\0';
    out33[0x1d] = '\0';
    out33[0x1e] = '\0';
    out33[0x1f] = '\0';
    out33[0] = '\0';
    out33[1] = '\0';
    out33[2] = '\0';
    out33[3] = '\0';
    out33[4] = '\0';
    out33[5] = '\0';
    out33[6] = '\0';
    out33[7] = '\0';
    out33[8] = '\0';
    out33[9] = '\0';
    out33[10] = '\0';
    out33[0xb] = '\0';
    out33[0xc] = '\0';
    out33[0xd] = '\0';
    out33[0xe] = '\0';
    out33[0xf] = '\0';
    out33[0x20] = '\0';
    out33[0x21] = '\0';
    out33[0x22] = '\0';
    out33[0x23] = '\0';
    lVar3 = 0;
    bVar1 = false;
    uVar4 = 0;
    do {
      uVar4 = (uint)*(byte *)(extraout_RDX + lVar3) | uVar4 << 8;
      if (0xc < uVar4) {
        bVar1 = true;
        uVar4 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    if (bVar1) {
      return;
    }
    out33[0] = 0xeb;
    out33[1] = 0xfb;
    out33[2] = '\x1a';
    out33[3] = '2';
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    out33[0x14] = '\0';
    out33[0x15] = '\0';
    out33[0x16] = '\0';
    out33[0x17] = '\0';
    out33[0x18] = '\0';
    out33[0x19] = '\0';
    out33[0x1a] = '\0';
    out33[0x1b] = '\0';
    out33[0x1c] = '\0';
    out33[0x1d] = '\0';
    out33[0x1e] = '\0';
    out33[0x1f] = '\0';
    out33[4] = '\0';
    out33[5] = '\0';
    out33[6] = '\0';
    out33[7] = '\0';
    out33[8] = '\0';
    out33[9] = '\0';
    out33[10] = '\0';
    out33[0xb] = '\0';
    out33[0xc] = '\0';
    out33[0xd] = '\0';
    out33[0xe] = '\0';
    out33[0xf] = '\0';
    out33[0x10] = '\0';
    out33[0x11] = '\0';
    out33[0x12] = '\0';
    out33[0x13] = '\0';
    *(uint *)(out33 + 0x20) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    return;
  }
  secp256k1_musig_partial_sig_parse_cold_2();
  return;
}

Assistant:

static void secp256k1_musig_ge_serialize_ext(unsigned char *out33, secp256k1_ge* ge) {
    if (secp256k1_ge_is_infinity(ge)) {
        memset(out33, 0, 33);
    } else {
        int ret;
        size_t size = 33;
        ret = secp256k1_eckey_pubkey_serialize(ge, out33, &size, 1);
#ifdef VERIFY
        /* Serialize must succeed because the point is not at infinity */
        VERIFY_CHECK(ret && size == 33);
#else
        (void) ret;
#endif
    }
}